

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_part.c
# Opt level: O0

int cmime_part_from_string(CMimePart_T **part,char *content)

{
  char *__s2;
  int iVar1;
  size_t sVar2;
  char *local_50;
  char *it;
  char *dlb;
  char *lb;
  char *body;
  char *ptemp2;
  char *ptemp;
  char *content_local;
  CMimePart_T **part_local;
  
  ptemp2 = (char *)0x0;
  body = (char *)0x0;
  lb = (char *)0x0;
  dlb = (char *)0x0;
  ptemp = content;
  content_local = (char *)part;
  if (*part == (CMimePart_T *)0x0) {
    __assert_fail("(*part)",
                  "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_part.c"
                  ,0x199,"int cmime_part_from_string(CMimePart_T **, const char *)");
  }
  if (content == (char *)0x0) {
    __assert_fail("content",
                  "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_part.c"
                  ,0x19a,"int cmime_part_from_string(CMimePart_T **, const char *)");
  }
  dlb = _cmime_internal_determine_linebreak(content);
  if (dlb == (char *)0x0) {
    part_local._4_4_ = -1;
  }
  else {
    asprintf(&it,"%s%s",dlb,dlb);
    ptemp2 = strstr(ptemp,it);
    if (ptemp2 == (char *)0x0) {
      lb = strdup(ptemp);
    }
    else {
      for (local_50 = ptemp; *local_50 != '\0'; local_50 = local_50 + 1) {
        iVar1 = strncasecmp(local_50,"Content-Type:",0xd);
        if (iVar1 == 0) {
          local_50 = local_50 + 0xe;
          body = _parse_header(local_50);
          cmime_part_set_content_type(*(CMimePart_T **)content_local,body);
          free(body);
        }
        iVar1 = strncasecmp(local_50,"Content-Transfer-Encoding:",0x1a);
        if (iVar1 == 0) {
          local_50 = local_50 + 0x1b;
          body = _parse_header(local_50);
          cmime_part_set_content_transfer_encoding(*(CMimePart_T **)content_local,body);
          free(body);
        }
        iVar1 = strncasecmp(local_50,"Content-Disposition:",0x14);
        if (iVar1 == 0) {
          local_50 = local_50 + 0x15;
          body = _parse_header(local_50);
          cmime_part_set_content_disposition(*(CMimePart_T **)content_local,body);
          free(body);
        }
        iVar1 = strncasecmp(local_50,"Content-ID:",0xb);
        if (iVar1 == 0) {
          local_50 = local_50 + 0xc;
          body = _parse_header(local_50);
          cmime_part_set_content_id(*(CMimePart_T **)content_local,body);
          free(body);
        }
        __s2 = it;
        sVar2 = strlen(it);
        iVar1 = strncmp(local_50,__s2,sVar2);
        if (iVar1 == 0) break;
      }
      sVar2 = strlen(it);
      ptemp2 = ptemp2 + sVar2;
      lb = strdup(ptemp2);
    }
    cmime_part_set_content(*(CMimePart_T **)content_local,lb);
    free(lb);
    free(it);
    part_local._4_4_ = 0;
  }
  return part_local._4_4_;
}

Assistant:

int cmime_part_from_string(CMimePart_T **part, const char *content) {
    char *ptemp = NULL;
    char *ptemp2 = NULL;
    char *body = NULL;
    char *lb = NULL;
    char *dlb;
    char *it = NULL;

    assert((*part));
    assert(content);
    
    lb = _cmime_internal_determine_linebreak(content);
    if (lb == NULL)
        return(-1);
    
    asprintf(&dlb,"%s%s",lb,lb);

    ptemp = strstr(content,dlb);
    if (ptemp != NULL) {
        it = (char *)content;
        while (*it != '\0') {
            if (strncasecmp(it,PART_CONTENT_TYPE_PATTERN,strlen(PART_CONTENT_TYPE_PATTERN))==0) {               
                it = it + sizeof(PART_CONTENT_TYPE_PATTERN);
                ptemp2 = _parse_header(it);         
                cmime_part_set_content_type((*part),ptemp2);
                free(ptemp2);
            }

            if (strncasecmp(it,PART_CONTENT_TRANSFER_ENCODING_PATTERN,strlen(PART_CONTENT_TRANSFER_ENCODING_PATTERN))==0) {
                it = it + sizeof(PART_CONTENT_TRANSFER_ENCODING_PATTERN);
                ptemp2 = _parse_header(it);
                cmime_part_set_content_transfer_encoding((*part),ptemp2);
                free(ptemp2);
            }
            
            if (strncasecmp(it,PART_CONTENT_DISPOSITION_PATTERN,strlen(PART_CONTENT_DISPOSITION_PATTERN))==0) {
                it = it + sizeof(PART_CONTENT_DISPOSITION_PATTERN);
                ptemp2 = _parse_header(it);
                cmime_part_set_content_disposition((*part),ptemp2);
                free(ptemp2);
            }   
                
            if (strncasecmp(it,PART_CONTENT_ID_PATTERN,strlen(PART_CONTENT_ID_PATTERN))==0) {
                it = it + sizeof(PART_CONTENT_ID_PATTERN);
                ptemp2 = _parse_header(it);
                cmime_part_set_content_id((*part),ptemp2);
                free(ptemp2);
            }   

            // break if body begins 
            if (strncmp(it,dlb,strlen(dlb))==0)
                break;
                
            it++;
        }
        
        ptemp += strlen(dlb);
        body = strdup(ptemp);
    } else {
        body = strdup(content);
    }
    
    cmime_part_set_content((*part),body);
    free(body);
    free(dlb);
    
    return(0);
}